

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  pointer paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Bit_pointer puVar4;
  pointer pfVar5;
  PyTypeObject **ppPVar6;
  uint uVar7;
  uint uVar8;
  function_record *pfVar9;
  long lVar10;
  undefined8 extraout_RAX;
  ulong uVar11;
  handle hVar12;
  long *plVar13;
  type_info *ptVar14;
  long lVar15;
  PyTypeObject *pPVar16;
  _Bit_type *p_Var17;
  object *poVar18;
  PyObject *pPVar19;
  runtime_error *this;
  error_already_set *this_00;
  byte bVar20;
  argument_record aVar21;
  size_type *psVar22;
  ulong uVar23;
  uint __uval;
  uint __val;
  uint __len;
  PyTypeObject *pPVar24;
  int iVar25;
  ulong uVar26;
  size_t size;
  _Bit_type *p_Var27;
  size_t index;
  pointer pfVar28;
  PyTypeObject *pPVar29;
  bool bVar30;
  handle value;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  dict kwargs;
  function_call call;
  tuple extra_args;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  undefined1 local_1c8 [32];
  _Bit_pointer local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  _Bit_pointer local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined4 local_144;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  handle *phStack_128;
  undefined1 auStack_120 [16];
  _Bit_type *local_110;
  handle hStack_108;
  _Bit_pointer local_100;
  handle local_f8;
  function_record *local_f0;
  allocator<char> local_e2;
  allocator<char> local_e1;
  PyObject *local_e0;
  ulong local_d8;
  handle local_d0;
  long local_c8;
  PyObject local_c0;
  ulong local_b0;
  ulong local_a8;
  uint local_9c;
  PyTypeObject *local_98;
  PyTypeObject *local_88;
  PyTypeObject *local_80;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_> local_78
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  PyTypeObject **local_38;
  
  pfVar9 = (function_record *)PyCapsule_GetPointer(self,0);
  local_f0 = pfVar9;
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                  ,0x189,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_b0 = args_in[1].ob_refcnt;
  if (local_b0 == 0) {
    local_88 = (PyTypeObject *)0x0;
  }
  else {
    local_88 = args_in[1].ob_type;
  }
  local_78.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_start = (function_call *)0x0;
  local_78.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_finish = (function_call *)0x0;
  local_78.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (PyTypeObject *)args_in;
  if (pfVar9 == (function_record *)0x0) {
    local_144 = 0;
    local_e0 = (PyObject *)0x1;
  }
  else {
    local_144 = (undefined4)
                CONCAT71((int7)((ulong)local_88 >> 8),pfVar9->next != (function_record *)0x0);
    local_38 = &args_in[1].ob_type;
    local_e0 = (PyObject *)0x1;
    local_80 = (PyTypeObject *)kwargs_in;
    do {
      bVar20 = (pfVar9->field_0x59 & 8) >> 3;
      uVar26 = (long)((char)(pfVar9->field_0x59 << 3) >> 7) + ((ulong)pfVar9->nargs - (ulong)bVar20)
      ;
      if (((bVar20 == 0) && (uVar26 < local_b0)) ||
         ((local_b0 < uVar26 &&
          ((ulong)((long)(pfVar9->args).
                         super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pfVar9->args).
                         super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar26)))) {
        bVar30 = false;
      }
      else {
        local_110 = (_Bit_type *)0x0;
        hStack_108.m_ptr = hStack_108.m_ptr & 0xffffffff00000000;
        local_100 = (_Bit_pointer)0x0;
        auStack_120._8_8_ = auStack_120._8_8_ & 0xffffffff00000000;
        phStack_128 = (handle *)0x0;
        auStack_120._0_8_ = (PyTypeObject *)0x0;
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (handle *)0x0;
        local_f8.m_ptr = (PyObject *)local_88;
        local_140 = (undefined1  [8])pfVar9;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)local_138,
                   (ulong)pfVar9->nargs);
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)auStack_120,(ulong)pfVar9->nargs);
        local_a8 = uVar26;
        if (local_b0 < uVar26) {
          local_a8 = local_b0;
        }
        local_d8 = uVar26;
        if (local_a8 == 0) {
          uVar26 = 0;
        }
        else {
          lVar15 = 0;
          uVar26 = 0;
          do {
            if (((((PyTypeObject *)kwargs_in != (PyTypeObject *)0x0) &&
                 (paVar1 = (pfVar9->args).
                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                 uVar26 < (ulong)((long)(pfVar9->args).
                                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >>
                                 5))) && (*(long *)(paVar1 + lVar15) != 0)) &&
               (lVar10 = PyDict_GetItemString(kwargs_in), lVar10 != 0)) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,pfVar9->name,&local_e1);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_d0);
              local_168._M_dataplus._M_p = (pointer)*plVar13;
              psVar22 = (size_type *)(plVar13 + 2);
              if ((size_type *)local_168._M_dataplus._M_p == psVar22) {
                local_168.field_2._M_allocated_capacity = *psVar22;
                local_168.field_2._8_8_ = plVar13[3];
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              }
              else {
                local_168.field_2._M_allocated_capacity = *psVar22;
              }
              local_168._M_string_length = plVar13[1];
              *plVar13 = (long)psVar22;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_58,
                         *(char **)((pfVar9->args).
                                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar15),&local_e2);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_198,&local_168,&local_58);
              plVar13 = (long *)std::__cxx11::string::append(local_198);
              local_1c8._0_8_ = *plVar13;
              pPVar19 = (PyObject *)(plVar13 + 2);
              if ((PyObject *)local_1c8._0_8_ == pPVar19) {
                local_1c8._16_8_ = pPVar19->ob_refcnt;
                local_1c8._24_8_ = plVar13[3];
                local_1c8._0_8_ = (PyObject *)(local_1c8 + 0x10);
              }
              else {
                local_1c8._16_8_ = pPVar19->ob_refcnt;
              }
              local_1c8._8_8_ = plVar13[1];
              *plVar13 = (long)pPVar19;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              std::runtime_error::runtime_error(this,(string *)local_1c8);
              *(undefined ***)this = &PTR__runtime_error_00153a18;
              __cxa_throw(this,&type_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if (((*(PyTypeObject **)((long)&((PyTypeObject *)args_in)->ob_base + 8))->tp_flags &
                0x4000000) == 0) {
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                            ,0x1ca,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1c8._0_8_ = (&((PyTypeObject *)args_in)->tp_name)[uVar26];
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
            emplace_back<pybind11::handle>
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)local_138,
                       (handle *)local_1c8);
            paVar1 = (pfVar9->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            aVar21 = (argument_record)0x1;
            if (uVar26 < (ulong)((long)(pfVar9->args).
                                       super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >>
                                5)) {
              aVar21 = paVar1[lVar15 + 0x18];
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_120,(bool)((byte)aVar21 & 1));
            uVar26 = uVar26 + 1;
            lVar15 = lVar15 + 0x20;
          } while (local_a8 != uVar26);
        }
        if ((PyTypeObject *)kwargs_in != (PyTypeObject *)0x0) {
          (((PyTypeObject *)kwargs_in)->ob_base).ob_base.ob_refcnt =
               (((PyTypeObject *)kwargs_in)->ob_base).ob_base.ob_refcnt + 1;
        }
        local_168._M_dataplus._M_p = (pointer)kwargs_in;
        if (uVar26 < local_d8) {
          lVar15 = uVar26 << 5;
          bVar30 = true;
          local_9c = 0;
          do {
            paVar1 = (pfVar9->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1c8._0_8_ = (PyTypeObject *)0x0;
            if (((PyTypeObject *)kwargs_in != (PyTypeObject *)0x0) &&
               (*(long *)(paVar1 + lVar15) != 0)) {
              local_1c8._0_8_ = PyDict_GetItemString(local_168._M_dataplus._M_p);
            }
            if ((PyTypeObject *)local_1c8._0_8_ == (PyTypeObject *)0x0) {
              if (*(long *)(paVar1 + lVar15 + 0x10) != 0) {
                local_1c8._0_8_ = *(undefined8 *)(paVar1 + lVar15 + 0x10);
              }
            }
            else {
              if ((local_9c & 1) == 0) {
                local_198._0_8_ = PyDict_Copy(local_168._M_dataplus._M_p);
                object::operator=((object *)&local_168,(object *)local_198);
                object::~object((object *)local_198);
                local_9c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
              PyDict_DelItemString(local_168._M_dataplus._M_p);
            }
            uVar2 = local_1c8._0_8_;
            if ((PyTypeObject *)local_1c8._0_8_ == (PyTypeObject *)0x0) {
LAB_0013dbf3:
              args_in = (PyObject *)local_98;
              kwargs_in = (PyObject *)local_80;
              if (bVar30) goto LAB_0013dc2a;
              break;
            }
            if ((handle *)local_138._8_8_ == phStack_128) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_138,
                         (iterator)local_138._8_8_,(handle *)local_1c8);
            }
            else {
              *(PyObject **)local_138._8_8_ = (PyObject *)local_1c8._0_8_;
              local_138._8_8_ = local_138._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_120,
                       (bool)((byte)paVar1[lVar15 + 0x18] & 1));
            if ((PyTypeObject *)uVar2 == (PyTypeObject *)0x0) goto LAB_0013dbf3;
            uVar26 = uVar26 + 1;
            lVar15 = lVar15 + 0x20;
            bVar30 = uVar26 < local_d8;
            args_in = (PyObject *)local_98;
            kwargs_in = (PyObject *)local_80;
          } while (bVar30);
        }
        if ((((PyTypeObject *)local_168._M_dataplus._M_p == (PyTypeObject *)0x0) ||
            (lVar15 = PyDict_Size(), lVar15 == 0)) || ((pfVar9->field_0x59 & 0x10) != 0)) {
          tuple::tuple((tuple *)&local_d0,0);
          if ((pfVar9->field_0x59 & 8) != 0) {
            if (local_a8 == 0) {
              local_1c8._0_8_ = args_in;
              if ((PyTypeObject *)args_in != (PyTypeObject *)0x0) {
                (((PyTypeObject *)args_in)->ob_base).ob_base.ob_refcnt =
                     (((PyTypeObject *)args_in)->ob_base).ob_base.ob_refcnt + 1;
              }
LAB_0013dd31:
              object::operator=((object *)&local_d0,(object *)local_1c8);
              object::~object((object *)local_1c8);
            }
            else {
              size = local_b0 - uVar26;
              if (local_b0 < uVar26 || size == 0) {
                tuple::tuple((tuple *)local_1c8,0);
                goto LAB_0013dd31;
              }
              tuple::tuple((tuple *)local_1c8,size);
              object::operator=((object *)&local_d0,(object *)local_1c8);
              object::~object((object *)local_1c8);
              ppPVar6 = local_38;
              if (local_b0 != uVar26) {
                index = 0;
                do {
                  if (((*(PyTypeObject **)((long)&((PyTypeObject *)args_in)->ob_base + 8))->tp_flags
                      & 0x4000000) == 0) {
                    __assert_fail("PyTuple_Check(args_in)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                                  ,0x204,
                                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                 );
                  }
                  hVar12.m_ptr = (PyObject *)ppPVar6[uVar26 + index];
                  if (hVar12.m_ptr != (PyObject *)0x0) {
                    (hVar12.m_ptr)->ob_refcnt = (hVar12.m_ptr)->ob_refcnt + 1;
                  }
                  local_1c8._8_8_ = local_d0.m_ptr;
                  local_1c8._24_8_ = 0;
                  local_1c8._16_8_ = index;
                  detail::accessor_policies::tuple_item::set(local_d0,index,hVar12);
                  object::~object((object *)(local_1c8 + 0x18));
                  index = index + 1;
                } while (size != index);
              }
            }
            if ((handle *)local_138._8_8_ == phStack_128) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_138,
                         (iterator)local_138._8_8_,&local_d0);
            }
            else {
              *(PyObject **)local_138._8_8_ = local_d0.m_ptr;
              local_138._8_8_ = local_138._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_120,false);
          }
          if ((pfVar9->field_0x59 & 0x10) != 0) {
            if ((PyTypeObject *)local_168._M_dataplus._M_p == (PyTypeObject *)0x0) {
              dict::dict((dict *)local_1c8);
              object::operator=((object *)&local_168,(object *)local_1c8);
              object::~object((object *)local_1c8);
            }
            if ((handle *)local_138._8_8_ == phStack_128) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_138,
                         (iterator)local_138._8_8_,(handle *)&local_168);
            }
            else {
              *(PyObject **)local_138._8_8_ = (PyObject *)local_168._M_dataplus._M_p;
              local_138._8_8_ = local_138._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_120,false);
          }
          uVar26 = local_d8;
          uVar11 = (ulong)pfVar9->nargs;
          if (((long)(local_138._8_8_ - local_138._0_8_) >> 3 != uVar11) ||
             (((ulong)hStack_108.m_ptr & 0xffffffff) + ((long)local_110 - auStack_120._0_8_) * 8 !=
              uVar11)) {
            pybind11_fail(
                         "Internal error: function call dispatcher inserted wrong number of arguments!"
                         );
          }
          local_198._0_8_ = (PyObject *)0x0;
          local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
          local_188._0_8_ = (_Bit_type *)0x0;
          local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
          local_178 = (_Bit_pointer)0x0;
          if ((byte)local_144 != '\0') {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)local_198,uVar11,false);
            puVar4 = local_100;
            hVar12.m_ptr = hStack_108.m_ptr;
            p_Var27 = local_110;
            uVar3 = auStack_120._8_8_;
            uVar2 = auStack_120._0_8_;
            local_1a8 = local_100;
            local_1c8._16_8_ = local_110;
            local_1c8._24_8_ = hStack_108.m_ptr;
            local_1c8._0_8_ = auStack_120._0_8_;
            local_1c8._8_8_ = auStack_120._8_8_;
            local_100 = local_178;
            local_110 = (_Bit_type *)local_188._0_8_;
            hStack_108.m_ptr = (PyObject *)local_188._8_8_;
            auStack_120._0_8_ = local_198._0_8_;
            auStack_120._8_8_ = local_198._8_8_;
            local_198._0_8_ = uVar2;
            local_198._8_8_ = uVar3;
            local_188._0_8_ = p_Var27;
            local_188._8_8_ = hVar12.m_ptr;
            local_178 = puVar4;
          }
          local_e0 = (PyObject *)(*pfVar9->impl)((function_call *)local_140);
          puVar4 = local_100;
          hVar12.m_ptr = hStack_108.m_ptr;
          p_Var27 = local_110;
          uVar3 = auStack_120._8_8_;
          uVar2 = auStack_120._0_8_;
          bVar30 = local_e0 != (PyObject *)0x1;
          if (((byte)local_144 & local_e0 == (PyObject *)0x1) != 0) {
            bVar30 = false;
            for (uVar11 = (ulong)((byte)pfVar9->field_0x59 >> 5 & 1); uVar11 < uVar26;
                uVar11 = uVar11 + 1) {
              uVar23 = uVar11 + 0x3f;
              if (-1 < (long)uVar11) {
                uVar23 = uVar11;
              }
              if ((*(ulong *)(local_198._0_8_ +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                             ((long)uVar23 >> 6) * 8 + -8) >> (uVar11 & 0x3f) & 1) != 0) {
                local_1a8 = local_100;
                local_1c8._16_8_ = local_110;
                local_1c8._24_8_ = hStack_108.m_ptr;
                local_1c8._0_8_ = auStack_120._0_8_;
                local_1c8._8_8_ = auStack_120._8_8_;
                bVar30 = false;
                local_100 = local_178;
                local_110 = (_Bit_type *)local_188._0_8_;
                hStack_108.m_ptr = (PyObject *)local_188._8_8_;
                auStack_120._0_8_ = local_198._0_8_;
                auStack_120._8_8_ = local_198._8_8_;
                local_198._0_8_ = uVar2;
                local_198._8_8_ = uVar3;
                local_188._0_8_ = p_Var27;
                local_188._8_8_ = hVar12.m_ptr;
                local_178 = puVar4;
                std::
                vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                ::emplace_back<pybind11::detail::function_call>
                          (&local_78,(function_call *)local_140);
                break;
              }
            }
          }
          if ((PyTypeObject *)local_198._0_8_ != (PyTypeObject *)0x0) {
            operator_delete((void *)local_198._0_8_,(long)local_178 - local_198._0_8_);
            local_198._0_8_ = (PyObject *)0x0;
            local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
            local_188._0_8_ = (_Bit_type *)0x0;
            local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
            local_178 = (_Bit_pointer)0x0;
          }
          object::~object((object *)&local_d0);
        }
        else {
LAB_0013dc2a:
          bVar30 = false;
        }
        object::~object((object *)&local_168);
        if ((PyTypeObject *)auStack_120._0_8_ != (PyTypeObject *)0x0) {
          operator_delete((void *)auStack_120._0_8_,(long)local_100 - auStack_120._0_8_);
          auStack_120._0_8_ = (PyTypeObject *)0x0;
          auStack_120._8_8_ = auStack_120._8_8_ & 0xffffffff00000000;
          local_110 = (_Bit_type *)0x0;
          hStack_108.m_ptr = hStack_108.m_ptr & 0xffffffff00000000;
          local_100 = (_Bit_pointer)0x0;
        }
        if ((pointer)local_138._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_138._0_8_,(long)phStack_128 - local_138._0_8_);
        }
      }
    } while ((!bVar30) && (pfVar9 = pfVar9->next, pfVar9 != (function_record *)0x0));
  }
  pfVar5 = local_78.
           super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pfVar9 = local_f0;
  hVar12.m_ptr = local_e0;
  if (((byte)local_144 != '\0') &&
     ((local_78.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_78.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_finish &&
      (pfVar28 = local_78.
                 super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 ._M_impl.super__Vector_impl_data._M_start, local_e0 == (PyObject *)0x1)))) {
    do {
      hVar12 = (*pfVar28->func->impl)(pfVar28);
      if (hVar12.m_ptr != (PyObject *)0x1) break;
      pfVar28 = pfVar28 + 1;
    } while (pfVar28 != pfVar5);
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector(&local_78);
  pPVar24 = local_88;
  if (hVar12.m_ptr == (PyObject *)0x0) {
    local_140 = (undefined1  [8])(local_138 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_140);
    PyErr_SetString(_PyExc_TypeError,local_140);
    if (local_140 == (undefined1  [8])(local_138 + 8)) {
      return (PyObject *)0x0;
    }
    goto LAB_0013e959;
  }
  if (hVar12.m_ptr != (PyObject *)0x1) {
    if ((pfVar9->field_0x59 & 1) != 0) {
      ptVar14 = detail::get_type_info((local_88->ob_base).ob_base.ob_type);
      (*ptVar14->init_holder)((PyObject *)pPVar24,(void *)0x0);
      return hVar12.m_ptr;
    }
    return hVar12.m_ptr;
  }
  if ((pfVar9->field_0x59 & 4) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,pfVar9->name,(allocator<char> *)&local_58);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
  pPVar24 = (PyTypeObject *)(plVar13 + 2);
  if ((PyTypeObject *)*plVar13 == pPVar24) {
    local_188._0_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
    local_188._8_8_ = plVar13[3];
    local_198._0_8_ = (PyObject *)local_188;
  }
  else {
    local_188._0_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
    local_198._0_8_ = (PyObject *)*plVar13;
  }
  local_198._8_8_ = plVar13[1];
  *plVar13 = (long)pPVar24;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  iVar25 = 0x147a7a;
  if ((pfVar9->field_0x59 & 1) != 0) {
    iVar25 = 0x147a6e;
  }
  local_d0.m_ptr = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,iVar25,iVar25 + ((byte)pfVar9->field_0x59 & 1) * 3 + 8);
  p_Var27 = (_Bit_type *)((long)&((PyVarObject *)local_198._8_8_)->ob_base + local_c8);
  p_Var17 = (_Bit_type *)0xf;
  if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
    p_Var17 = (_Bit_type *)local_188._0_8_;
  }
  if (p_Var17 < p_Var27) {
    p_Var17 = (_Bit_type *)0xf;
    if (local_d0.m_ptr != &local_c0) {
      p_Var17 = (_Bit_type *)local_c0.ob_refcnt;
    }
    if (p_Var17 < p_Var27) goto LAB_0013e393;
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,local_198._0_8_);
  }
  else {
LAB_0013e393:
    plVar13 = (long *)std::__cxx11::string::_M_append(local_198,(ulong)local_d0.m_ptr);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  pPVar24 = (PyTypeObject *)(plVar13 + 2);
  if ((PyTypeObject *)*plVar13 == pPVar24) {
    local_1c8._16_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
    local_1c8._24_8_ = plVar13[3];
  }
  else {
    local_1c8._16_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
    local_1c8._0_8_ = (PyTypeObject *)*plVar13;
  }
  local_1c8._8_8_ = plVar13[1];
  *plVar13 = (long)pPVar24;
  plVar13[1] = 0;
  *(undefined1 *)&(pPVar24->ob_base).ob_base = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_1c8);
  local_140 = (undefined1  [8])(local_138 + 8);
  pfVar9 = (function_record *)(plVar13 + 2);
  if ((function_record *)*plVar13 == pfVar9) {
    local_138._8_8_ = pfVar9->name;
    phStack_128 = (handle *)plVar13[3];
  }
  else {
    local_138._8_8_ = pfVar9->name;
    local_140 = (undefined1  [8])*plVar13;
  }
  local_138._0_8_ = plVar13[1];
  *plVar13 = (long)pfVar9;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if (local_d0.m_ptr != &local_c0) {
    operator_delete(local_d0.m_ptr,local_c0.ob_refcnt + 1);
  }
  if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
    operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  uVar26 = 0;
  pfVar9 = local_f0;
  do {
    __val = (uint)uVar26 + 1;
    uVar11 = (ulong)__val;
    __len = 1;
    if (8 < (uint)uVar26) {
      uVar26 = uVar11;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar8 = (uint)uVar26;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_0013e531;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_0013e531;
        }
        if (uVar8 < 10000) goto LAB_0013e531;
        uVar26 = uVar26 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_0013e531:
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_168,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_168._M_dataplus._M_p,__len,__val);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x147abc);
    pPVar24 = (PyTypeObject *)(plVar13 + 2);
    if ((PyTypeObject *)*plVar13 == pPVar24) {
      local_188._0_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
      local_188._8_8_ = plVar13[3];
      local_198._0_8_ = (PyObject *)local_188;
    }
    else {
      local_188._0_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
      local_198._0_8_ = (PyObject *)*plVar13;
    }
    local_198._8_8_ = plVar13[1];
    *plVar13 = (long)pPVar24;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append(local_198);
    local_1c8._0_8_ = local_1c8 + 0x10;
    pPVar24 = (PyTypeObject *)(plVar13 + 2);
    if ((PyTypeObject *)*plVar13 == pPVar24) {
      local_1c8._16_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
      local_1c8._24_8_ = plVar13[3];
    }
    else {
      local_1c8._16_8_ = (pPVar24->ob_base).ob_base.ob_refcnt;
      local_1c8._0_8_ = (PyTypeObject *)*plVar13;
    }
    local_1c8._8_8_ = plVar13[1];
    *plVar13 = (long)pPVar24;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_140,local_1c8._0_8_);
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
      operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((local_f0->field_0x59 & 1) == 0) {
LAB_0013e7c6:
      std::__cxx11::string::append((char *)local_140);
      uVar26 = uVar11;
    }
    else {
      local_a8 = uVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,pfVar9->signature,(allocator<char> *)local_198);
      lVar15 = std::__cxx11::string::find((char)local_1c8,0x28);
      pPVar24 = (PyTypeObject *)(lVar15 + 7);
      if ((ulong)local_1c8._8_8_ <= pPVar24) {
LAB_0013e799:
        uVar11 = local_a8;
        if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          uVar11 = local_a8;
        }
        goto LAB_0013e7c6;
      }
      pPVar16 = (PyTypeObject *)std::__cxx11::string::find(local_1c8,0x1457ea,0);
      local_d8 = std::__cxx11::string::rfind(local_1c8,0x147ac1,0xffffffffffffffff);
      if (pPVar16 < (ulong)local_1c8._8_8_) {
        pPVar29 = (PyTypeObject *)((long)&(pPVar16->ob_base).ob_base + 2);
      }
      else {
        pPVar16 = (PyTypeObject *)std::__cxx11::string::find((char)local_1c8,0x29);
        pPVar29 = pPVar16;
      }
      if ((pPVar16 <= pPVar24) || ((ulong)local_1c8._8_8_ <= pPVar29)) goto LAB_0013e799;
      std::__cxx11::string::append((string *)local_140,(ulong)local_1c8,(ulong)pPVar24);
      std::__cxx11::string::push_back((char)(string *)local_140);
      std::__cxx11::string::append((string *)local_140,(ulong)local_1c8,(ulong)pPVar29);
      uVar26 = local_a8;
      if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        uVar26 = local_a8;
      }
    }
    std::__cxx11::string::append((char *)local_140);
    pfVar9 = pfVar9->next;
  } while (pfVar9 != (function_record *)0x0);
  std::__cxx11::string::append(local_140);
  local_168._M_dataplus._M_p = (pointer)local_98;
  if (local_98 != (PyTypeObject *)0x0) {
    (local_98->ob_base).ob_base.ob_refcnt = (local_98->ob_base).ob_base.ob_refcnt + 1;
  }
  p_Var27 = (_Bit_type *)(ulong)((byte)local_f0->field_0x59 & 1);
  while (p_Var17 = (_Bit_type *)PyTuple_Size(local_168._M_dataplus._M_p), p_Var27 < p_Var17) {
    local_198._8_8_ = local_168._M_dataplus._M_p;
    local_188._8_8_ = (PyObject *)0x0;
    local_188._0_8_ = p_Var27;
    poVar18 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_198);
    local_58._M_dataplus._M_p = (pointer)(poVar18->super_handle).m_ptr;
    if ((PyObject *)local_58._M_dataplus._M_p != (PyObject *)0x0) {
      ((PyObject *)local_58._M_dataplus._M_p)->ob_refcnt =
           ((PyObject *)local_58._M_dataplus._M_p)->ob_refcnt + 1;
    }
    pPVar19 = (PyObject *)PyObject_Repr(local_58._M_dataplus._M_p);
    if (pPVar19 == (PyObject *)0x0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_d0.m_ptr = pPVar19;
    str::operator_cast_to_string((string *)local_1c8,(str *)&local_d0);
    std::__cxx11::string::_M_append(local_140,local_1c8._0_8_);
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    object::~object((object *)&local_d0);
    object::~object((object *)&local_58);
    object::~object((object *)(local_188 + 8));
    lVar15 = PyTuple_Size(local_168._M_dataplus._M_p);
    p_Var27 = (_Bit_type *)((long)p_Var27 + 1);
    if (p_Var27 != (_Bit_type *)lVar15) {
      std::__cxx11::string::append(local_140);
    }
  }
  PyErr_SetString(_PyExc_TypeError,local_140);
  object::~object((object *)&local_168);
  if (local_140 == (undefined1  [8])(local_138 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0013e959:
  operator_delete((void *)local_140,(ulong)((long)(PyObject **)local_138._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                for (; args_copied < args_to_copy; ++args_copied) {
                    // If we find a given positional argument that also has a named kwargs argument,
                    // raise a TypeError like Python does.  (We could also continue with the next
                    // overload, but this seems highly likely to be a caller mistake rather than a
                    // legitimate overload).
                    if (kwargs_in && args_copied < func.args.size() && func.args[args_copied].name) {
                        handle value = PyDict_GetItemString(kwargs_in, func.args[args_copied].name);
                        if (value)
                            throw type_error(std::string(func.name) + "(): got multiple values for argument '" +
                                    std::string(func.args[args_copied].name) + "'");
                    }

                    call.args.push_back(PyTuple_GET_ITEM(args_in, args_copied));
                    call.args_convert.push_back(args_copied < func.args.size() ? func.args[args_copied].convert : true);
                }

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                auto tinfo = get_type_info(Py_TYPE(parent.ptr()));
                tinfo->init_holder(parent.ptr(), nullptr);
            }
            return result.ptr();
        }
    }